

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

size_t aead_encrypt(st_ptls_traffic_protection_t *ctx,void *output,void *input,size_t inlen,
                   uint8_t content_type)

{
  st_ptls_aead_context_t *psVar1;
  uint64_t uVar2;
  long lVar3;
  uint8_t content_type_local;
  uint8_t aad [5];
  ptls_iovec_t invec [2];
  
  invec[1].base = &content_type_local;
  invec[1].len = 1;
  psVar1 = ctx->aead;
  lVar3 = psVar1->algo->tag_size + inlen + 1;
  aad[0] = '\x17';
  aad[1] = '\x03';
  aad[2] = '\x03';
  aad[3] = (uint8_t)((ulong)lVar3 >> 8);
  aad[4] = (uint8_t)lVar3;
  uVar2 = ctx->seq;
  ctx->seq = uVar2 + 1;
  content_type_local = content_type;
  invec[0].base = (uint8_t *)input;
  invec[0].len = inlen;
  (*psVar1->do_encrypt_v)(psVar1,output,invec,2,uVar2,aad,5);
  return inlen + 1 + ctx->aead->algo->tag_size;
}

Assistant:

static size_t aead_encrypt(struct st_ptls_traffic_protection_t *ctx, void *output, const void *input, size_t inlen,
                           uint8_t content_type)
{
    ptls_iovec_t invec[2] = {ptls_iovec_init(input, inlen), ptls_iovec_init(&content_type, 1)};
    uint8_t aad[5];

    build_aad(aad, inlen + 1 + ctx->aead->algo->tag_size);
    ptls_aead_encrypt_v(ctx->aead, output, invec, PTLS_ELEMENTSOF(invec), ctx->seq++, aad, sizeof(aad));

    return inlen + 1 + ctx->aead->algo->tag_size;
}